

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Vector3<long_double> *
s2pred::GetClosestVertex<long_double>
          (Vector3<long_double> *__return_storage_ptr__,Vector3<long_double> *x,
          Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *ax2)

{
  bool bVar1;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble in_ST1;
  D local_a8;
  undefined1 auStack_78 [8];
  longdouble a1x2;
  undefined1 auStack_38 [8];
  longdouble a0x2;
  longdouble *ax2_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  Vector3<long_double> *x_local;
  
  unique0x100000e2 = ax2;
  ax2_local = (longdouble *)a1;
  a1_local = a0;
  a0_local = x;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)((long)&a1x2 + 8),(BasicVector<Vector3,_long_double,_3UL> *)a0,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)((long)&a1x2 + 8),(BasicVector<Vector3,_long_double,_3UL> *)a0);
  this = (BasicVector<Vector3,_long_double,_3UL> *)ax2_local;
  _auStack_38 = in_ST0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_a8,(BasicVector<Vector3,_long_double,_3UL> *)ax2_local,a0_local);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)&local_a8,this);
  if (in_ST1 <= _auStack_38) {
    _auStack_78 = in_ST1;
    if (((_auStack_38 != in_ST1) || (NAN(_auStack_38) || NAN(in_ST1))) ||
       (bVar1 = util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator<
                          ((BasicVector<Vector3,_long_double,_3UL> *)a1_local,(D *)ax2_local),
       !bVar1)) {
      *stack0xffffffffffffffd8 = _auStack_78;
      memcpy(__return_storage_ptr__,ax2_local,0x30);
      return __return_storage_ptr__;
    }
  }
  *stack0xffffffffffffffd8 = _auStack_38;
  memcpy(__return_storage_ptr__,a1_local,0x30);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3<T> GetClosestVertex(const Vector3<T>& x, const Vector3<T>& a0,
                                   const Vector3<T>& a1, T* ax2) {
  T a0x2 = (a0 - x).Norm2();
  T a1x2 = (a1 - x).Norm2();
  if (a0x2 < a1x2 || (a0x2 == a1x2 && a0 < a1)) {
    *ax2 = a0x2;
    return a0;
  } else {
    *ax2 = a1x2;
    return a1;
  }
}